

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O3

void Qentem::Test::TestRawVariableTag3(QTest *test)

{
  TagBit *pTVar1;
  QTest *pQVar2;
  char *pcVar3;
  Array<Qentem::Tags::TagBit> tags_cache;
  Value<char> value;
  StringStream<char> ss;
  Array<Qentem::Tags::TagBit> local_a8;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_98;
  undefined8 local_88;
  char *local_80;
  undefined4 local_78;
  QTest *local_70;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_68;
  undefined1 local_58;
  StringStream<char> local_48;
  
  local_48.storage_ = (char *)0x0;
  local_48.length_ = 0;
  local_48.capacity_ = 0;
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_68._8_8_ = 0;
  local_58 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_88 = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:0}";
  local_78 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{raw:0}",7,&local_a8)
  ;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,&local_48,(char (*) [8])0x131611,0x518);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:a}";
  local_78 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{raw:a}",7,&local_a8)
  ;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,&local_48,(char (*) [8])"{raw:a}",0x51b);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:0[0]}";
  local_78 = 10;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:0[0]}",10,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>
            (test,&local_48,(char (*) [11])"{raw:0[0]}",0x51f);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:a[0]}";
  local_78 = 10;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:a[0]}",10,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>
            (test,&local_48,(char (*) [11])"{raw:a[0]}",0x523);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:0[a]}";
  local_78 = 10;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:0[a]}",10,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>
            (test,&local_48,(char (*) [11])"{raw:0[a]}",0x527);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:a[abc]}";
  local_78 = 0xc;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:a[abc]}",0xc,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  local_70 = test;
  QTest::IsEqual<Qentem::StringStream<char>,char[13]>
            (test,&local_48,(char (*) [13])"{raw:a[abc]}",0x52b);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  JSON::JSONParser<char,_Qentem::StringStream<char>_>::Parse
            ((ValueT *)&local_98.array_,(StringStream<char> *)&local_a8,
             "[[[]],{\"a\":[\"x\"],\"b\":{\"a\":\"X\"}}]",0x20);
  pTVar1 = local_a8.storage_;
  if (local_a8.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_a8.storage_);
  }
  operator_delete(pTVar1);
  Value<char>::operator=((Value<char> *)&local_68.array_,(Value<char> *)&local_98.array_);
  Value<char>::~Value((Value<char> *)&local_98.array_);
  local_88 = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:0}";
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_78 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{raw:0}",7,&local_a8)
  ;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  pQVar2 = local_70;
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>
            (local_70,&local_48,(char (*) [8])0x131611,0x533);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:0[0]}";
  local_78 = 10;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:0[0]}",10,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>
            (pQVar2,&local_48,(char (*) [11])"{raw:0[0]}",0x537);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:0[0][0]}";
  local_78 = 0xd;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:0[0][0]}",0xd,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (pQVar2,&local_48,(char (*) [14])"{raw:0[0][0]}",0x53b);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:1}";
  local_78 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{raw:1}",7,&local_a8)
  ;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(pQVar2,&local_48,(char (*) [8])"{raw:1}",0x541)
  ;
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:2}";
  local_78 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{raw:2}",7,&local_a8)
  ;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(pQVar2,&local_48,(char (*) [8])0x1314b7,0x545);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:1[a]}";
  local_78 = 10;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:1[a]}",10,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>
            (pQVar2,&local_48,(char (*) [11])"{raw:1[a]}",0x549);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:1[b]}";
  local_78 = 10;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:1[b]}",10,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>
            (pQVar2,&local_48,(char (*) [11])"{raw:1[b]}",0x54d);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  JSON::JSONParser<char,_Qentem::StringStream<char>_>::Parse
            ((ValueT *)&local_98.array_,(StringStream<char> *)&local_a8,
             "[\"A\", \"abc\", true, 456, 1.5]",0x1c);
  pTVar1 = local_a8.storage_;
  if (local_a8.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_a8.storage_);
  }
  operator_delete(pTVar1);
  Value<char>::operator=((Value<char> *)&local_68.array_,(Value<char> *)&local_98.array_);
  Value<char>::~Value((Value<char> *)&local_98.array_);
  local_88 = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:0";
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_78 = 6;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{raw:0",6,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  pQVar2 = local_70;
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>
            (local_70,&local_48,(char (*) [7])"{raw:0",0x555);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "raw:0}";
  local_78 = 6;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("raw:0}",6,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(pQVar2,&local_48,(char (*) [7])0x131612,0x559);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{r}";
  local_78 = 3;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{r}",3,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(pQVar2,&local_48,(char (*) [4])"{r}",0x55d);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{ra}";
  local_78 = 4;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{ra}",4,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(pQVar2,&local_48,(char (*) [5])"{ra}",0x561);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw}";
  local_78 = 5;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{raw}",5,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(pQVar2,&local_48,(char (*) [6])"{raw}",0x565);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:}";
  local_78 = 6;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{raw:}",6,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(pQVar2,&local_48,(char (*) [7])"{raw:}",0x569);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{r:0}";
  local_78 = 5;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{r:0}",5,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(pQVar2,&local_48,(char (*) [6])"{r:0}",0x56d);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{ra:0}";
  local_78 = 6;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{ra:0}",6,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(pQVar2,&local_48,(char (*) [7])"{ra:0}",0x571);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:0{raw:0}";
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_78 = 0xd;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:0{raw:0}",0xd,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(pQVar2,&local_48,(char (*) [8])"{raw:0A",0x577)
  ;
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "raw:0{raw:0}";
  local_78 = 0xc;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("raw:0{raw:0}",0xc,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(pQVar2,&local_48,(char (*) [7])0x131724,0x57b);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "raw:0}{raw:0}";
  local_78 = 0xd;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("raw:0}{raw:0}",0xd,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(pQVar2,&local_48,(char (*) [8])"raw:0}A",0x57f)
  ;
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:0{raw:0}{raw:0}";
  local_78 = 0x14;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:0{raw:0}{raw:0}",0x14,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>
            (pQVar2,&local_48,(char (*) [9])"{raw:0AA",0x583);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:1{raw:0}";
  local_78 = 0xd;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:1{raw:0}",0xd,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(pQVar2,&local_48,(char (*) [8])"{raw:1A",0x589)
  ;
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "raw:1{raw:0}";
  local_78 = 0xc;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("raw:1{raw:0}",0xc,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(pQVar2,&local_48,(char (*) [7])0x131760,0x58d);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "raw:1}{raw:0}";
  local_78 = 0xd;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("raw:1}{raw:0}",0xd,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(pQVar2,&local_48,(char (*) [8])"raw:1}A",0x591)
  ;
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:1{raw:0}{raw:0}";
  local_78 = 0x14;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:1{raw:0}{raw:0}",0x14,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>
            (pQVar2,&local_48,(char (*) [9])"{raw:1AA",0x595);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{{raw:0}";
  local_78 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{{raw:0}",8,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(pQVar2,&local_48,(char (*) [3])"{A",0x59b);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{{raw:0}{raw:0}";
  local_78 = 0xf;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{{raw:0}{raw:0}",0xf,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(pQVar2,&local_48,(char (*) [4])"{AA",0x59f);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{r{raw:0}";
  local_78 = 9;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{r{raw:0}",9,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(pQVar2,&local_48,(char (*) [4])"{rA",0x5a3);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{r{raw:0}{raw:0}";
  local_78 = 0x10;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{r{raw:0}{raw:0}",0x10,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(pQVar2,&local_48,(char (*) [5])"{rAA",0x5a7);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{ra{raw:0}";
  local_78 = 10;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{ra{raw:0}",10,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(pQVar2,&local_48,(char (*) [5])"{raA",0x5ab);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{ra{raw:0}{raw:0}";
  local_78 = 0x11;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{ra{raw:0}{raw:0}",0x11,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(pQVar2,&local_48,(char (*) [6])"{raAA",0x5af);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw{raw:0}";
  local_78 = 0xb;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw{raw:0}",0xb,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(pQVar2,&local_48,(char (*) [6])"{rawA",0x5b3);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw{raw:0}{raw:0}";
  local_78 = 0x12;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw{raw:0}{raw:0}",0x12,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(pQVar2,&local_48,(char (*) [7])"{rawAA",0x5b7);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{-{raw:0}";
  local_78 = 9;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{-{raw:0}",9,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(pQVar2,&local_48,(char (*) [4])"{-A",0x5bd);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{-{raw:0}{raw:0}";
  local_78 = 0x10;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{-{raw:0}{raw:0}",0x10,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(pQVar2,&local_48,(char (*) [5])"{-AA",0x5c1);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{r-{raw:0}";
  local_78 = 10;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{r-{raw:0}",10,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(pQVar2,&local_48,(char (*) [5])"{r-A",0x5c5);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{r-{raw:0}{raw:0}";
  local_78 = 0x11;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{r-{raw:0}{raw:0}",0x11,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(pQVar2,&local_48,(char (*) [6])"{r-AA",0x5c9);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{ra-{raw:0}";
  local_78 = 0xb;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{ra-{raw:0}",0xb,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(pQVar2,&local_48,(char (*) [6])"{ra-A",0x5cd);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{ra-{raw:0}{raw:0}";
  local_78 = 0x12;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{ra-{raw:0}{raw:0}",0x12,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(pQVar2,&local_48,(char (*) [7])"{ra-AA",0x5d1);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw-{raw:0}";
  local_78 = 0xc;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw-{raw:0}",0xc,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(pQVar2,&local_48,(char (*) [7])"{raw-A",0x5d5);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw-{raw:0}{raw:0}";
  local_78 = 0x13;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw-{raw:0}{raw:0}",0x13,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(pQVar2,&local_48,(char (*) [8])"{raw-AA",0x5d9)
  ;
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw-0}";
  local_78 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{raw-0}",7,&local_a8)
  ;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(pQVar2,&local_48,(char (*) [8])"{raw-0}",0x5df)
  ;
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw 0}";
  local_78 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{raw 0}",7,&local_a8)
  ;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(pQVar2,&local_48,(char (*) [8])"{raw 0}",0x5e3)
  ;
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:0 }";
  local_78 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:0 }",8,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>
            (pQVar2,&local_48,(char (*) [9])"{raw:0 }",0x5e7);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:0 ";
  local_78 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{raw:0 ",7,&local_a8)
  ;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(pQVar2,&local_48,(char (*) [8])"{raw:0 ",0x5eb)
  ;
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{raw:0";
  local_78 = 6;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{raw:0",6,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(pQVar2,&local_48,(char (*) [7])"{raw:0",0x5ef);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{ raw-0}";
  local_78 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{ raw-0}",8,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>
            (pQVar2,&local_48,(char (*) [9])"{ raw-0}",0x5f3);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{ raw 0}";
  local_78 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{ raw 0}",8,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>
            (pQVar2,&local_48,(char (*) [9])"{ raw 0}",0x5f7);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{ raw:0 }";
  local_78 = 9;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{ raw:0 }",9,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[10]>
            (pQVar2,&local_48,(char (*) [10])"{ raw:0 }",0x5fb);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{ raw:0 ";
  local_78 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{ raw:0 ",8,&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>
            (pQVar2,&local_48,(char (*) [9])"{ raw:0 ",0x5ff);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_80 = "{ raw:0";
  local_78 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse("{ raw:0",7,&local_a8)
  ;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_98.array_,&local_a8,(Value<char> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(pQVar2,&local_48,(char (*) [8])"{ raw:0",0x603)
  ;
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::~Value((Value<char> *)&local_68.array_);
  pcVar3 = local_48.storage_;
  if (local_48.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_48.storage_);
  }
  operator_delete(pcVar3);
  return;
}

Assistant:

static void TestRawVariableTag3(QTest &test) {
    StringStream<char> ss;
    Value<char>        value;
    const char        *content;

    content = R"({raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0})", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"({raw:a})", value, ss), R"({raw:a})", __LINE__);
    ss.Clear();

    content = R"({raw:0[0]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), R"({raw:0[0]})", __LINE__);
    ss.Clear();

    content = R"({raw:a[0]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), R"({raw:a[0]})", __LINE__);
    ss.Clear();

    content = R"({raw:0[a]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), R"({raw:0[a]})", __LINE__);
    ss.Clear();

    content = R"({raw:a[abc]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), R"({raw:a[abc]})", __LINE__);
    ss.Clear();

    ////////////////

    value = JSON::Parse(R"([[[]],{"a":["x"],"b":{"a":"X"}}])");

    content = R"({raw:0})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), R"({raw:0})", __LINE__);
    ss.Clear();

    content = R"({raw:0[0]})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0[0]})", __LINE__);
    ss.Clear();

    content = R"({raw:0[0][0]})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0[0][0]})", __LINE__);
    ss.Clear();

    /////

    content = R"({raw:1})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:1})", __LINE__);
    ss.Clear();

    content = R"({raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:2})", __LINE__);
    ss.Clear();

    content = R"({raw:1[a]})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:1[a]})", __LINE__);
    ss.Clear();

    content = R"({raw:1[b]})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:1[b]})", __LINE__);
    ss.Clear();

    ////

    value = JSON::Parse(R"(["A", "abc", true, 456, 1.5])");

    content = R"({raw:0)";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0)", __LINE__);
    ss.Clear();

    content = R"(raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(raw:0})", __LINE__);
    ss.Clear();

    content = R"({r})";
    test.IsEqual(Template::Render(content, value, ss), R"({r})", __LINE__);
    ss.Clear();

    content = R"({ra})";
    test.IsEqual(Template::Render(content, value, ss), R"({ra})", __LINE__);
    ss.Clear();

    content = R"({raw})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw})", __LINE__);
    ss.Clear();

    content = R"({raw:})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:})", __LINE__);
    ss.Clear();

    content = R"({r:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({r:0})", __LINE__);
    ss.Clear();

    content = R"({ra:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({ra:0})", __LINE__);
    ss.Clear();

    ////

    content = R"({raw:0{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0A)", __LINE__);
    ss.Clear();

    content = R"(raw:0{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(raw:0A)", __LINE__);
    ss.Clear();

    content = R"(raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(raw:0}A)", __LINE__);
    ss.Clear();

    content = R"({raw:0{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0AA)", __LINE__);
    ss.Clear();

    ////

    content = R"({raw:1{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:1A)", __LINE__);
    ss.Clear();

    content = R"(raw:1{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(raw:1A)", __LINE__);
    ss.Clear();

    content = R"(raw:1}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(raw:1}A)", __LINE__);
    ss.Clear();

    content = R"({raw:1{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:1AA)", __LINE__);
    ss.Clear();

    ////

    content = R"({{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({A)", __LINE__);
    ss.Clear();

    content = R"({{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({AA)", __LINE__);
    ss.Clear();

    content = R"({r{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({rA)", __LINE__);
    ss.Clear();

    content = R"({r{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({rAA)", __LINE__);
    ss.Clear();

    content = R"({ra{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raA)", __LINE__);
    ss.Clear();

    content = R"({ra{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raAA)", __LINE__);
    ss.Clear();

    content = R"({raw{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({rawA)", __LINE__);
    ss.Clear();

    content = R"({raw{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({rawAA)", __LINE__);
    ss.Clear();

    ///

    content = R"({-{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({-A)", __LINE__);
    ss.Clear();

    content = R"({-{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({-AA)", __LINE__);
    ss.Clear();

    content = R"({r-{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({r-A)", __LINE__);
    ss.Clear();

    content = R"({r-{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({r-AA)", __LINE__);
    ss.Clear();

    content = R"({ra-{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({ra-A)", __LINE__);
    ss.Clear();

    content = R"({ra-{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({ra-AA)", __LINE__);
    ss.Clear();

    content = R"({raw-{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw-A)", __LINE__);
    ss.Clear();

    content = R"({raw-{raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw-AA)", __LINE__);
    ss.Clear();

    //

    content = R"({raw-0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw-0})", __LINE__);
    ss.Clear();

    content = R"({raw 0})";
    test.IsEqual(Template::Render(content, value, ss), R"({raw 0})", __LINE__);
    ss.Clear();

    content = R"({raw:0 })";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0 })", __LINE__);
    ss.Clear();

    content = R"({raw:0 )";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0 )", __LINE__);
    ss.Clear();

    content = R"({raw:0)";
    test.IsEqual(Template::Render(content, value, ss), R"({raw:0)", __LINE__);
    ss.Clear();

    content = R"({ raw-0})";
    test.IsEqual(Template::Render(content, value, ss), R"({ raw-0})", __LINE__);
    ss.Clear();

    content = R"({ raw 0})";
    test.IsEqual(Template::Render(content, value, ss), R"({ raw 0})", __LINE__);
    ss.Clear();

    content = R"({ raw:0 })";
    test.IsEqual(Template::Render(content, value, ss), R"({ raw:0 })", __LINE__);
    ss.Clear();

    content = R"({ raw:0 )";
    test.IsEqual(Template::Render(content, value, ss), R"({ raw:0 )", __LINE__);
    ss.Clear();

    content = R"({ raw:0)";
    test.IsEqual(Template::Render(content, value, ss), R"({ raw:0)", __LINE__);
    ss.Clear();
}